

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O0

bool __thiscall
GF2::MI<6UL,_GF2::MOGrevlex<6UL>_>::Reduce(MI<6UL,_GF2::MOGrevlex<6UL>_> *this,iterator pos)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *polyRight;
  Geobucket<2UL> *this_00;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *mRight;
  long in_RDI;
  iterator iterPoly;
  MP<6UL,_GF2::MOGrevlex<6UL>_> poly;
  MM<6UL> lm;
  bool changed;
  Geobucket<2UL> gb;
  MOGrevlex<6UL> *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  byte bVar4;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *in_stack_ffffffffffffff08;
  list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff20;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined7 in_stack_ffffffffffffff48;
  _Self local_a0;
  _List_node_base *local_98;
  _Self local_90;
  _Self local_88 [8];
  byte local_41;
  _Self local_8;
  
  std::_List_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>::operator*
            ((_List_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_> *)0x1c28e6);
  MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<2UL>::Geobucket
            ((Geobucket<2UL> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28);
  std::_List_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>::operator->
            ((_List_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_> *)0x1c2900);
  MP<6UL,_GF2::MOGrevlex<6UL>_>::SetEmpty((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x1c2908);
  local_41 = 0;
  MM<6UL>::MM((MM<6UL> *)0x1c291d);
  MP<6UL,_GF2::MOGrevlex<6UL>_>::MP
            ((MP<6UL,_GF2::MOGrevlex<6UL>_> *)
             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8
            );
  do {
    uVar1 = MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<2UL>::PopLM
                      ((Geobucket<2UL> *)
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       (MM<6UL> *)in_stack_ffffffffffffff28);
    if (!(bool)uVar1) {
      bVar4 = local_41;
      MP<6UL,_GF2::MOGrevlex<6UL>_>::~MP((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x1c2bbc);
      MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<2UL>::~Geobucket
                ((Geobucket<2UL> *)CONCAT17(bVar4,in_stack_ffffffffffffff00));
      return (bool)(bVar4 & 1);
    }
    local_88[0]._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
         ::begin((list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                  *)in_stack_fffffffffffffef8);
    while( true ) {
      local_90._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
           ::end((list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                  *)in_stack_fffffffffffffef8);
      bVar2 = std::operator!=(local_88,&local_90);
      if (!bVar2) break;
      bVar2 = std::operator==(local_88,&local_8);
      if (!bVar2) {
        polyRight = (MP<6UL,_GF2::MOGrevlex<6UL>_> *)(in_RDI + 0x18);
        std::_List_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>::operator->
                  ((_List_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_> *)0x1c2a17);
        this_00 = (Geobucket<2UL> *)
                  MP<6UL,_GF2::MOGrevlex<6UL>_>::LM
                            ((MP<6UL,_GF2::MOGrevlex<6UL>_> *)
                             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
        in_stack_ffffffffffffff34 =
             MOGrevlex<6UL>::Compare
                       ((MOGrevlex<6UL> *)CONCAT17(uVar1,in_stack_ffffffffffffff48),
                        (MM<6UL> *)this_00,(MM<6UL> *)polyRight);
        if (0 < in_stack_ffffffffffffff34) {
          local_98 = (_List_node_base *)
                     std::__cxx11::
                     list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                     ::end((list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                            *)in_stack_fffffffffffffef8);
          local_88[0]._M_node = local_98;
          break;
        }
        std::_List_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>::operator->
                  ((_List_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_> *)0x1c2a7a);
        in_stack_ffffffffffffff28 =
             (MP<6UL,_GF2::MOGrevlex<6UL>_> *)
             MP<6UL,_GF2::MOGrevlex<6UL>_>::LM
                       ((MP<6UL,_GF2::MOGrevlex<6UL>_> *)
                        CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
        uVar3 = MM<6ul>::operator|((MM<6UL> *)
                                   CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                                   (MM<6UL> *)in_stack_fffffffffffffef8);
        if ((bool)uVar3) {
          local_41 = 1;
          std::_List_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>::operator*
                    ((_List_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_> *)0x1c2ac3);
          mRight = MP<6UL,_GF2::MOGrevlex<6UL>_>::operator=
                             ((MP<6UL,_GF2::MOGrevlex<6UL>_> *)
                              CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                              (MP<6UL,_GF2::MOGrevlex<6UL>_> *)in_stack_fffffffffffffef8);
          MP<6UL,_GF2::MOGrevlex<6UL>_>::PopLM((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x1c2ae4);
          std::_List_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>::operator->
                    ((_List_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_> *)0x1c2af3);
          in_stack_ffffffffffffff10 =
               (list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)
               MP<6UL,_GF2::MOGrevlex<6UL>_>::LM
                         ((MP<6UL,_GF2::MOGrevlex<6UL>_> *)
                          CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
          MM<6UL>::operator/=((MM<6UL> *)in_stack_ffffffffffffff10,
                              (MM<6UL> *)in_stack_ffffffffffffff08);
          in_stack_ffffffffffffff08 =
               MP<6UL,_GF2::MOGrevlex<6UL>_>::operator*=
                         ((MP<6UL,_GF2::MOGrevlex<6UL>_> *)CONCAT17(uVar3,in_stack_ffffffffffffff20)
                          ,(MM<6UL> *)mRight);
          MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<2UL>::SymDiffSplice(this_00,polyRight);
          break;
        }
      }
      std::_List_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>::operator++(local_88);
    }
    local_a0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
         ::end((list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                *)in_stack_fffffffffffffef8);
    bVar2 = std::operator==(local_88,&local_a0);
    if (bVar2) {
      std::_List_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>::operator->
                ((_List_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_> *)0x1c2b8b);
      std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::push_back
                (in_stack_ffffffffffffff10,(value_type *)in_stack_ffffffffffffff08);
    }
  } while( true );
}

Assistant:

bool Reduce(iterator pos)
	{	
		typename MP<_n, _O>::template Geobucket<2> gb(*pos);
		// будем сохранять в *pos остаток
		pos->SetEmpty();
		// цикл деления
		bool changed = false;
		MM<_n> lm;
		MP<_n, _O> poly(_order);
		while (gb.PopLM(lm))
		{
			iterator iterPoly = begin();
			for (; iterPoly != end(); ++iterPoly)
			{
				// пропускаем многочлен в позиции pos
				if (iterPoly == pos) continue;
				// все остальное без изменений
				if (_order.Compare(iterPoly->LM(), lm) > 0)
				{
					iterPoly = end();
					break;
				}
				else if (iterPoly->LM() | lm)
				{
					changed = true;
					(poly = *iterPoly).PopLM();
					gb.SymDiffSplice(poly *= (lm /= iterPoly->LM()));
					break;
				}
			}
			if (iterPoly == end()) pos->push_back(lm);
		}
		return changed;
	}